

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

InterchangeObject * __thiscall
ASDCP::MXF::InterchangeObject::WriteToBuffer(InterchangeObject *this,FrameBuffer *Buffer)

{
  bool bVar1;
  ui32_t uVar2;
  int iVar3;
  byte_t *pbVar4;
  IPrimerLookup *in_RDX;
  Result_t local_e8 [104];
  ui32_t local_80;
  ui32_t packet_length;
  undefined1 local_69;
  undefined1 local_68 [8];
  TLVWriter MemWRT;
  FrameBuffer *Buffer_local;
  InterchangeObject *this_local;
  Result_t *result;
  
  MemWRT.m_Lookup = in_RDX;
  bVar1 = Kumu::Identifier<16U>::HasValue((Identifier<16U> *)(Buffer + 1));
  if (bVar1) {
    pbVar4 = FrameBuffer::Data((FrameBuffer *)MemWRT.m_Lookup);
    uVar2 = FrameBuffer::Capacity((FrameBuffer *)MemWRT.m_Lookup);
    TLVWriter::TLVWriter
              ((TLVWriter *)local_68,pbVar4 + 0x14,uVar2 - 0x14,
               (IPrimerLookup *)Buffer[2]._vptr_FrameBuffer);
    local_69 = 0;
    (*Buffer->_vptr_FrameBuffer[0xd])(this,Buffer,(TLVWriter *)local_68);
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar3) {
      local_80 = Kumu::MemIOWriter::Length((MemIOWriter *)local_68);
      (*Buffer->_vptr_FrameBuffer[8])(local_e8,Buffer,MemWRT.m_Lookup);
      Kumu::Result_t::operator=((Result_t *)this,local_e8);
      Kumu::Result_t::~Result_t(local_e8);
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
      if (-1 < iVar3) {
        uVar2 = FrameBuffer::Size((FrameBuffer *)MemWRT.m_Lookup);
        FrameBuffer::Size((FrameBuffer *)MemWRT.m_Lookup,uVar2 + local_80);
      }
    }
    local_69 = 1;
    TLVWriter::~TLVWriter((TLVWriter *)local_68);
  }
  else {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::InterchangeObject::WriteToBuffer(ASDCP::FrameBuffer& Buffer)
{
  if ( ! m_UL.HasValue() )
    return RESULT_STATE;

  TLVWriter MemWRT(Buffer.Data() + kl_length, Buffer.Capacity() - kl_length, m_Lookup);
  Result_t result = WriteToTLVSet(MemWRT);

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t packet_length = MemWRT.Length();
      result = WriteKLToBuffer(Buffer, packet_length);

      if ( ASDCP_SUCCESS(result) )
	Buffer.Size(Buffer.Size() + packet_length);
    }

  return result;
}